

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O0

string * __thiscall
glcts::GeometryShaderIncompleteGSTest::getGeometryShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderIncompleteGSTest *this,_run *current_run)

{
  stringstream local_1a8 [8];
  stringstream gs_code_sstream;
  ostream local_198;
  _run *local_20;
  _run *current_run_local;
  GeometryShaderIncompleteGSTest *this_local;
  
  local_20 = current_run;
  current_run_local = (_run *)this;
  this_local = (GeometryShaderIncompleteGSTest *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(&local_198,"${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\n");
  if ((local_20->is_input_primitive_type_defined & 1U) != 0) {
    std::operator<<(&local_198,"layout(points) in;\n");
  }
  if (((local_20->is_max_vertices_defined & 1U) != 0) ||
     ((local_20->is_output_primitive_type_defined & 1U) != 0)) {
    std::operator<<(&local_198,"layout(");
    if (((local_20->is_max_vertices_defined & 1U) != 0) &&
       (std::operator<<(&local_198,"max_vertices = 1"),
       (local_20->is_output_primitive_type_defined & 1U) != 0)) {
      std::operator<<(&local_198,", ");
    }
    if ((local_20->is_output_primitive_type_defined & 1U) != 0) {
      std::operator<<(&local_198,"points");
    }
    std::operator<<(&local_198,") out;\n");
  }
  std::operator<<(&local_198,
                  "\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n    EmitVertex();\n}\n"
                 );
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderIncompleteGSTest::getGeometryShaderCode(const _run& current_run)
{
	std::stringstream gs_code_sstream;

	gs_code_sstream << "${VERSION}\n"
					   "${GEOMETRY_SHADER_REQUIRE}\n"
					   "\n";

	if (current_run.is_input_primitive_type_defined)
	{
		gs_code_sstream << "layout(points) in;\n";
	}

	if (current_run.is_max_vertices_defined || current_run.is_output_primitive_type_defined)
	{
		gs_code_sstream << "layout(";

		if (current_run.is_max_vertices_defined)
		{
			gs_code_sstream << "max_vertices = 1";

			if (current_run.is_output_primitive_type_defined)
			{
				gs_code_sstream << ", ";
			}
		} /* if (current_run.is_max_vertices_defined) */

		if (current_run.is_output_primitive_type_defined)
		{
			gs_code_sstream << "points";
		}

		gs_code_sstream << ") out;\n";
	}

	gs_code_sstream << "\n"
					   "void main()\n"
					   "{\n"
					   "    gl_Position = gl_in[0].gl_Position;\n"
					   "    EmitVertex();\n"
					   "}\n";

	return gs_code_sstream.str();
}